

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputToFont.cpp
# Opt level: O0

void __thiscall
GrcManager::OutputSileTable
          (GrcManager *this,GrcBinaryStream *pbstrm,utf16 *pchSrcFontFamily,char *pchSrcFileName,
          uint luMasterChecksum,uint *pnCreateTime,uint *pnModifyTime,int *pibOffset,int *pcbSize)

{
  int iVar1;
  offset_t oVar2;
  size_t sVar3;
  char *in_RCX;
  utf16 *in_RDX;
  GrcManager *in_RDI;
  GrcBinaryStream *in_R9;
  offset_t lPos;
  size_t cchFile;
  uint ich;
  size_t cchFontFamily;
  int fxd;
  undefined4 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  unsigned_short in_stack_ffffffffffffff9e;
  undefined4 local_44;
  undefined4 in_stack_ffffffffffffffc8;
  
  oVar2 = GrcBinaryStream::Position((GrcBinaryStream *)in_RDI);
  *(int *)lPos = (int)oVar2;
  iVar1 = VersionForTable(in_RDI,CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c));
  GrcBinaryStream::WriteInt<int>
            ((GrcBinaryStream *)in_RDI,CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c)
            );
  GrcBinaryStream::WriteInt<unsigned_int>
            ((GrcBinaryStream *)in_RDI,CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c)
            );
  GrcBinaryStream::WriteInt<unsigned_int>
            ((GrcBinaryStream *)in_RDI,CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c)
            );
  GrcBinaryStream::WriteInt<unsigned_int>
            ((GrcBinaryStream *)in_RDI,CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c)
            );
  GrcBinaryStream::WriteInt<unsigned_int>
            ((GrcBinaryStream *)in_RDI,CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c)
            );
  GrcBinaryStream::WriteInt<unsigned_int>
            ((GrcBinaryStream *)in_RDI,CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c)
            );
  sVar3 = gr::utf16len(in_RDX);
  GrcBinaryStream::WriteShort<unsigned_long>
            ((GrcBinaryStream *)in_RDI,
             CONCAT26(in_stack_ffffffffffffff9e,
                      CONCAT24(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)));
  for (local_44 = 0; local_44 < sVar3; local_44 = local_44 + 1) {
    GrcBinaryStream::WriteShort<unsigned_short>((GrcBinaryStream *)in_RDI,in_stack_ffffffffffffff9e)
    ;
  }
  GrcBinaryStream::WriteByte<int>
            ((GrcBinaryStream *)in_RDI,CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c)
            );
  strlen(in_RCX);
  GrcBinaryStream::WriteShort<unsigned_long>
            ((GrcBinaryStream *)in_RDI,
             CONCAT26(in_stack_ffffffffffffff9e,
                      CONCAT24(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)));
  GrcBinaryStream::Write
            ((GrcBinaryStream *)in_RDI,
             (void *)CONCAT26(in_stack_ffffffffffffff9e,
                              CONCAT24(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)),
             0x24ae79);
  GrcBinaryStream::WriteByte<int>
            ((GrcBinaryStream *)in_RDI,CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c)
            );
  oVar2 = GrcBinaryStream::Position((GrcBinaryStream *)in_RDI);
  *(int *)cchFile = (int)oVar2 - *(int *)lPos;
  GrcBinaryStream::SeekPadLong(in_R9,CONCAT44(iVar1,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void GrcManager::OutputSileTable(GrcBinaryStream * pbstrm,
	 utf16 * pchSrcFontFamily, char * pchSrcFileName, unsigned int luMasterChecksum,
	 unsigned int * pnCreateTime, unsigned int * pnModifyTime,
	 int * pibOffset, int * pcbSize)
{
	*pibOffset = int(pbstrm->Position());

	// version
	int fxd = VersionForTable(ktiSile);
	pbstrm->WriteInt(fxd);

	// master check sum from source font
	pbstrm->WriteInt(luMasterChecksum);

	// create and modify times of source font
	pbstrm->WriteInt(pnCreateTime[0]);
	pbstrm->WriteInt(pnCreateTime[1]);
	pbstrm->WriteInt(pnModifyTime[0]);
	pbstrm->WriteInt(pnModifyTime[1]);

	// source font family name
	auto cchFontFamily = utf16len(pchSrcFontFamily);
	pbstrm->WriteShort(cchFontFamily);
	for (auto ich = 0U; ich < cchFontFamily; ++ich)
		pbstrm->WriteShort(pchSrcFontFamily[ich]);
	pbstrm->WriteByte(0);

	// source font file
	auto cchFile = strlen(pchSrcFileName);
	pbstrm->WriteShort(cchFile);
	pbstrm->Write(pchSrcFileName, cchFile);
	pbstrm->WriteByte(0);

	// handle size and padding
	auto lPos = pbstrm->Position();
	*pcbSize = int(lPos - *pibOffset);
	pbstrm->SeekPadLong(lPos);
}